

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

configuration *
nonius::detail::
parse_args<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (string *name,
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          first,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                last)

{
  argument_error *this;
  undefined8 in_RCX;
  undefined8 in_RDX;
  configuration *in_RDI;
  anon_class_1_0_00000001 merge_params;
  anon_class_1_0_00000001 is_param;
  anon_class_1_0_00000001 is_reporter;
  anon_class_1_0_00000001 is_ci;
  anon_class_1_0_00000001 is_positive;
  arguments args;
  configuration *cfg;
  string *in_stack_fffffffffffffbc0;
  arguments *in_stack_fffffffffffffbc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd0;
  assign_fn *in_stack_fffffffffffffbe0;
  allocator *paVar1;
  anon_class_1_0_00000001 *in_stack_fffffffffffffbe8;
  string *in_stack_fffffffffffffbf0;
  arguments *in_stack_fffffffffffffbf8;
  configuration *in_stack_fffffffffffffc00;
  assign_fn *in_stack_fffffffffffffc40;
  anon_class_1_0_00000001 *in_stack_fffffffffffffc48;
  string *in_stack_fffffffffffffc50;
  option_set *in_stack_fffffffffffffc58;
  string *psVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffc60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *variable;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffc68;
  configuration *is_valid;
  bool *args_00;
  param_configuration *variable_00;
  allocator local_2d1;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string local_258 [39];
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [39];
  undefined1 local_191 [40];
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  undefined1 local_c9 [40];
  undefined1 local_a1 [40];
  undefined1 local_79;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = in_RCX;
  local_10 = in_RDX;
  command_line_options();
  local_70 = local_10;
  local_78 = local_18;
  parse_arguments<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (in_stack_fffffffffffffc58,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  local_79 = 0;
  configuration::configuration(in_stack_fffffffffffffc00);
  args_00 = &in_RDI->help;
  variable_00 = (param_configuration *)local_a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_a1 + 1),"help",(allocator *)variable_00);
  parse<bool>((bool *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0)
  ;
  std::__cxx11::string::~string((string *)(local_a1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_a1);
  psVar2 = (string *)local_c9;
  is_valid = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_c9 + 1),"samples",(allocator *)psVar2);
  parse<int,nonius::detail::parse_args<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>(std::__cxx11::string_const&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::_lambda(int)_1_&,nonius::detail::assign_fn>
            (&in_stack_fffffffffffffc00->samples,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0
             ,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  std::__cxx11::string::~string((string *)(local_c9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_c9);
  paVar1 = &local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"resamples",paVar1);
  parse<int,nonius::detail::parse_args<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>(std::__cxx11::string_const&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::_lambda(int)_1_&,nonius::detail::assign_fn>
            (&in_stack_fffffffffffffc00->samples,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0
             ,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"confidence-interval",&local_119);
  parse<double,nonius::detail::parse_args<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>(std::__cxx11::string_const&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::_lambda(double)_1_&,nonius::detail::assign_fn>
            ((double *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0
             ,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"param",&local_141);
  parse<nonius::param_configuration,nonius::detail::parse_args<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>(std::__cxx11::string_const&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::_lambda(nonius::param_configuration_const&)_1_&,nonius::detail::parse_args<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>(std::__cxx11::string_const&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::_lambda(nonius::param_configuration&,nonius::param_configuration&&)_1_&>
            (variable_00,(arguments *)args_00,psVar2,(anon_class_1_0_00000001 *)is_valid,
             (anon_class_1_0_00000001 *)paVar1);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"output",&local_169);
  parse<std::__cxx11::string>
            (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  psVar2 = &in_RDI->reporter;
  variable = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_191;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_191 + 1),"reporter",(allocator *)variable);
  parse<std::__cxx11::string,nonius::detail::parse_args<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>(std::__cxx11::string_const&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::_lambda(std::__cxx11::string)_1_&,nonius::detail::assign_fn>
            (variable,(arguments *)psVar2,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
             in_stack_fffffffffffffc40);
  std::__cxx11::string::~string((string *)(local_191 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_191);
  paVar1 = &local_1b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"no-analysis",paVar1);
  parse<bool>((bool *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0)
  ;
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  paVar1 = &local_1e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"filter",paVar1);
  parse<std::__cxx11::string>
            (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"list",&local_209);
  parse<bool>((bool *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0)
  ;
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"list-params",&local_231);
  parse<bool>((bool *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0)
  ;
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"list-reporters",&local_259);
  parse<bool>((bool *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0)
  ;
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  paVar1 = &local_281;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"verbose",paVar1);
  parse<bool>((bool *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0)
  ;
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  paVar1 = &local_2a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"summary",paVar1);
  parse<bool>((bool *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0)
  ;
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  paVar1 = &local_2d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"title",paVar1);
  parse<std::__cxx11::string>
            (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  if (((in_RDI->verbose & 1U) != 0) && ((in_RDI->summary & 1U) != 0)) {
    this = (argument_error *)__cxa_allocate_exception(8);
    this->_vptr_argument_error = (_func_int **)0x0;
    argument_error::argument_error(this);
    __cxa_throw(this,&argument_error::typeinfo,argument_error::~argument_error);
  }
  local_79 = 1;
  std::
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_multimap
            ((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x209f38);
  return in_RDI;
}

Assistant:

configuration parse_args(std::string const& name, Iterator first, Iterator last) {
            try {
                auto args = detail::parse_arguments(command_line_options(), first, last);

                configuration cfg;

                auto is_positive = [](int x) { return x > 0; };
                auto is_ci = [](double x) { return x > 0 && x < 1; };
                auto is_reporter = [](std::string const x) { return global_reporter_registry().count(x) > 0; };
                auto is_param = [](param_configuration const& x) {
                    return !x.map.empty() || x.run;
                };
                auto merge_params = [](param_configuration& x, param_configuration&& y) {
                    x.map = std::move(x.map).merged(std::move(y.map));
                    if (y.run) x.run = y.run;
                };

                parse(cfg.help, args, "help");
                parse(cfg.samples, args, "samples", is_positive);
                parse(cfg.resamples, args, "resamples", is_positive);
                parse(cfg.confidence_interval, args, "confidence-interval", is_ci);
                parse(cfg.params, args, "param", is_param, merge_params);
                parse(cfg.output_file, args, "output");
                parse(cfg.reporter, args, "reporter", is_reporter);
                parse(cfg.no_analysis, args, "no-analysis");
                parse(cfg.filter_pattern, args, "filter");
                parse(cfg.list_benchmarks, args, "list");
                parse(cfg.list_params, args, "list-params");
                parse(cfg.list_reporters, args, "list-reporters");
                parse(cfg.verbose, args, "verbose");
                parse(cfg.summary, args, "summary");
                parse(cfg.title, args, "title");
                if(cfg.verbose && cfg.summary) throw argument_error();

                return cfg;
            } catch(...) {
                std::cout << help_text(name, command_line_options());
                throw argument_error();
            }
        }